

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Bus_ManReadInOutLoads(Bus_Man_t *p)

{
  SC_Lib *p_00;
  int iVar1;
  Abc_Obj_t *p_01;
  char *pcVar2;
  SC_Cell *pSVar3;
  float fVar4;
  int iCell;
  float MaxLoad;
  int i;
  Abc_Obj_t *pObj;
  Bus_Man_t *p_local;
  
  fVar4 = Abc_FrameReadMaxLoad();
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar4 = Abc_FrameReadMaxLoad();
    for (iCell = 0; iVar1 = Abc_NtkCoNum(p->pNtk), iCell < iVar1; iCell = iCell + 1) {
      p_01 = Abc_NtkCo(p->pNtk,iCell);
      Bus_SclObjSetCin(p_01,fVar4);
    }
  }
  pcVar2 = Abc_FrameReadDrivingCell();
  if (pcVar2 != (char *)0x0) {
    p_00 = p->pLib;
    pcVar2 = Abc_FrameReadDrivingCell();
    iVar1 = Abc_SclCellFind(p_00,pcVar2);
    if (iVar1 == -1) {
      pcVar2 = Abc_FrameReadDrivingCell();
      printf("Cannot find the default PI driving cell (%s) in the library.\n",pcVar2);
    }
    else {
      pSVar3 = SC_LibCell(p->pLib,iVar1);
      p->pPiDrive = pSVar3;
      if (p->pPiDrive == (SC_Cell *)0x0) {
        __assert_fail("p->pPiDrive != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                      ,0x98,"void Bus_ManReadInOutLoads(Bus_Man_t *)");
      }
      if (p->pPiDrive->n_inputs != 1) {
        __assert_fail("p->pPiDrive->n_inputs == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                      ,0x99,"void Bus_ManReadInOutLoads(Bus_Man_t *)");
      }
    }
  }
  return;
}

Assistant:

void Bus_ManReadInOutLoads( Bus_Man_t * p )
{
    if ( Abc_FrameReadMaxLoad() )
    {
        Abc_Obj_t * pObj; int i;
        float MaxLoad = Abc_FrameReadMaxLoad();
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            Bus_SclObjSetCin( pObj, MaxLoad );
//        printf( "Default output load is specified (%f ff).\n", MaxLoad );
    }
    if ( Abc_FrameReadDrivingCell() )
    {
        int iCell = Abc_SclCellFind( p->pLib, Abc_FrameReadDrivingCell() );
        if ( iCell == -1 )
            printf( "Cannot find the default PI driving cell (%s) in the library.\n", Abc_FrameReadDrivingCell() );
        else
        {
//            printf( "Default PI driving cell is specified (%s).\n", Abc_FrameReadDrivingCell() );
            p->pPiDrive = SC_LibCell( p->pLib, iCell );
            assert( p->pPiDrive != NULL );
            assert( p->pPiDrive->n_inputs == 1 );
//            printf( "Default input driving cell is specified (%s).\n", p->pPiDrive->pName );
        }
    }
}